

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynet.cc
# Opt level: O3

VariableIndex __thiscall
dynet::ComputationGraph::add_const_parameters(ComputationGraph *this,Parameter p)

{
  pointer *pppNVar1;
  iterator __position;
  ConstParameterNode *this_00;
  ParameterStorage *pPVar2;
  VariableIndex VVar3;
  VariableIndex new_node_index;
  VariableIndex local_34;
  ConstParameterNode *local_30;
  Parameter local_28;
  
  VVar3 = (VariableIndex)
          ((ulong)((long)(this->nodes).
                         super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->nodes).
                        super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 3);
  local_34 = VVar3;
  local_28.p = p.p;
  this_00 = (ConstParameterNode *)operator_new(0x98);
  ConstParameterNode::ConstParameterNode(this_00,&local_28);
  __position._M_current =
       (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_30 = this_00;
  if (__position._M_current ==
      (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<dynet::Node*,std::allocator<dynet::Node*>>::_M_realloc_insert<dynet::Node*>
              ((vector<dynet::Node*,std::allocator<dynet::Node*>> *)this,__position,
               (Node **)&local_30);
  }
  else {
    *__position._M_current = (Node *)this_00;
    pppNVar1 = &(this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  pPVar2 = Parameter::get_storage(&local_28);
  (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish[-1]->device = pPVar2->device;
  set_dim_for_new_node(this,&local_34);
  return VVar3;
}

Assistant:

VariableIndex ComputationGraph::add_const_parameters(Parameter p) {
  VariableIndex new_node_index(nodes.size());
  ConstParameterNode* new_node = new ConstParameterNode(p);
  nodes.push_back(new_node);
  nodes.back()->device = p.get_storage().device;
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}